

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * __thiscall
duckdb::QueryProfiler::ToString_abi_cxx11_
          (string *__return_storage_ptr__,QueryProfiler *this,ProfilerPrintFormat format)

{
  mutex *__mutex;
  ExplainFormat format_00;
  bool bVar1;
  pointer pPVar2;
  mapped_type *this_00;
  pointer pTVar3;
  type pPVar4;
  InternalException *this_01;
  QueryProfiler *this_02;
  double val;
  key_type local_221;
  TreeRenderer local_220;
  string local_218;
  Value local_1f8;
  stringstream str;
  undefined1 local_1a8 [376];
  
  if ((this->is_explain_analyze == false) && ((this->context->config).enable_profiler == false)) {
    RenderDisabledMessage_abi_cxx11_(__return_storage_ptr__,this,format);
  }
  else {
    switch(format) {
    case QUERY_TREE:
    case QUERY_TREE_OPTIMIZER:
      QueryTreeToString_abi_cxx11_(__return_storage_ptr__,this);
      break;
    case JSON:
      ToJSON_abi_cxx11_(__return_storage_ptr__,this);
      break;
    case NO_OUTPUT:
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,anon_var_dwarf_4b71df5 + 9,(allocator *)&str);
      break;
    case HTML:
    case GRAPHVIZ:
      __mutex = &this->lock;
      this_02 = (QueryProfiler *)__mutex;
      ::std::mutex::lock(__mutex);
      if (((this->query_info).query_name._M_string_length == 0) &&
         ((this->root).
          super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
          super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
          .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl ==
          (ProfilingNode *)0x0)) {
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,anon_var_dwarf_4b71df5 + 9,(allocator *)&str);
      }
      else {
        format_00 = GetExplainFormat(this_02,format);
        TreeRenderer::CreateRenderer(&local_220,format_00);
        ::std::__cxx11::stringstream::stringstream((stringstream *)&str);
        pPVar2 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                 ::operator->(&this->root);
        bVar1 = ProfilingInfo::Enabled(&(pPVar2->profiling_info).expanded_settings,OPERATOR_TIMING);
        if (bVar1) {
          val = BaseProfiler<std::chrono::_V2::steady_clock>::Elapsed(&this->main_query);
          Value::Value(&local_1f8,val);
          local_221 = OPERATOR_TIMING;
          this_00 = ::std::__detail::
                    _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(pPVar2->profiling_info).metrics,&local_221);
          Value::operator=(this_00,&local_1f8);
          Value::~Value(&local_1f8);
        }
        pTVar3 = unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>::
                 operator->((unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true>
                             *)&local_220);
        pPVar4 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>
                 ::operator*(&this->root);
        (*pTVar3->_vptr_TreeRenderer[4])(pTVar3,pPVar4,local_1a8);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&str);
        if (local_220._vptr_TreeRenderer != (_func_int **)0x0) {
          (**(code **)(*local_220._vptr_TreeRenderer + 8))();
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      break;
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&str,"Unknown ProfilerPrintFormat \"%s\"",(allocator *)&local_1f8);
      EnumUtil::ToString<duckdb::ProfilerPrintFormat>(&local_218,format);
      InternalException::InternalException<std::__cxx11::string>(this_01,(string *)&str,&local_218);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::ToString(ProfilerPrintFormat format) const {
	if (!IsEnabled()) {
		return RenderDisabledMessage(format);
	}
	switch (format) {
	case ProfilerPrintFormat::QUERY_TREE:
	case ProfilerPrintFormat::QUERY_TREE_OPTIMIZER:
		return QueryTreeToString();
	case ProfilerPrintFormat::JSON:
		return ToJSON();
	case ProfilerPrintFormat::NO_OUTPUT:
		return "";
	case ProfilerPrintFormat::HTML:
	case ProfilerPrintFormat::GRAPHVIZ: {
		lock_guard<std::mutex> guard(lock);
		// checking the tree to ensure the query is really empty
		// the query string is empty when a logical plan is deserialized
		if (query_info.query_name.empty() && !root) {
			return "";
		}
		auto renderer = TreeRenderer::CreateRenderer(GetExplainFormat(format));
		std::stringstream str;
		auto &info = root->GetProfilingInfo();
		if (info.Enabled(info.expanded_settings, MetricsType::OPERATOR_TIMING)) {
			info.metrics[MetricsType::OPERATOR_TIMING] = main_query.Elapsed();
		}
		renderer->Render(*root, str);
		return str.str();
	}
	default:
		throw InternalException("Unknown ProfilerPrintFormat \"%s\"", EnumUtil::ToString(format));
	}
}